

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_optimise_unretained(mpc_parser_t *p,int force)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  int in_ESI;
  undefined8 *in_RDI;
  mpc_parser_t *t;
  int m;
  int n;
  int i;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  if ((*(char *)((long)in_RDI + 0x31) == '\0') || (in_ESI != 0)) {
    if (*(char *)(in_RDI + 6) == '\x05') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x0f') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x10') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x19') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x1a') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x11') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x12') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x13') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x14') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x15') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x16') {
      mpc_optimise_unretained
                ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
    }
    if (*(char *)(in_RDI + 6) == '\x17') {
      for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 1); iVar4 = iVar4 + 1) {
        mpc_optimise_unretained((mpc_parser_t *)CONCAT44(in_ESI,iVar4),in_stack_ffffffffffffffec);
      }
    }
    if (*(char *)(in_RDI + 6) == '\x18') {
      for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 1); iVar4 = iVar4 + 1) {
        mpc_optimise_unretained((mpc_parser_t *)CONCAT44(in_ESI,iVar4),in_stack_ffffffffffffffec);
      }
    }
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while (((*(char *)(in_RDI + 6) == '\x17' &&
                          (*(char *)(*(long *)(in_RDI[2] + (long)(*(int *)(in_RDI + 1) + -1) * 8) +
                                    0x30) == '\x17')) &&
                         (*(char *)(*(long *)(in_RDI[2] + (long)(*(int *)(in_RDI + 1) + -1) * 8) +
                                   0x31) == '\0'))) {
                    puVar2 = *(undefined8 **)(in_RDI[2] + (long)(*(int *)(in_RDI + 1) + -1) * 8);
                    iVar4 = *(int *)(in_RDI + 1);
                    iVar1 = *(int *)(puVar2 + 1);
                    *(int *)(in_RDI + 1) = iVar4 + iVar1 + -1;
                    pvVar3 = realloc((void *)in_RDI[2],(long)(iVar4 + iVar1 + -1) << 3);
                    in_RDI[2] = pvVar3;
                    memmove((void *)(in_RDI[2] + (long)iVar4 * 8 + -8),(void *)puVar2[2],
                            (long)iVar1 << 3);
                    free((void *)puVar2[2]);
                    free((void *)*puVar2);
                    free(puVar2);
                  }
                  if (((*(char *)(in_RDI + 6) != '\x17') ||
                      (*(char *)(*(long *)in_RDI[2] + 0x30) != '\x17')) ||
                     (*(char *)(*(long *)in_RDI[2] + 0x31) != '\0')) break;
                  puVar2 = *(undefined8 **)in_RDI[2];
                  iVar4 = *(int *)(in_RDI + 1);
                  iVar1 = *(int *)(puVar2 + 1);
                  *(int *)(in_RDI + 1) = iVar4 + iVar1 + -1;
                  pvVar3 = realloc((void *)in_RDI[2],(long)(iVar4 + iVar1 + -1) << 3);
                  in_RDI[2] = pvVar3;
                  memmove((void *)(in_RDI[2] + (long)iVar1 * 8),(void *)(in_RDI[2] + 8),
                          (long)(iVar4 + -1) << 3);
                  memmove((void *)in_RDI[2],(void *)puVar2[2],(long)iVar1 << 3);
                  free((void *)puVar2[2]);
                  free((void *)*puVar2);
                  free(puVar2);
                }
                if (((*(char *)(in_RDI + 6) != '\x18') || (*(int *)(in_RDI + 1) != 2)) ||
                   ((*(char *)(*(long *)in_RDI[3] + 0x30) != '\x01' ||
                    ((*(char *)(*(long *)in_RDI[3] + 0x31) != '\0' ||
                     ((code *)in_RDI[2] != mpcf_fold_ast)))))) break;
                pvVar3 = *(void **)(in_RDI[3] + 8);
                mpc_delete((mpc_parser_t *)0x29eb28);
                free((void *)in_RDI[3]);
                free((void *)in_RDI[4]);
                free((void *)*in_RDI);
                memcpy(in_RDI,pvVar3,0x38);
                free(pvVar3);
              }
              if ((*(char *)(in_RDI + 6) != '\x18') ||
                 (((((code *)in_RDI[2] != mpcf_fold_ast ||
                    (*(char *)(*(long *)in_RDI[3] + 0x30) != '\x18')) ||
                   (*(char *)(*(long *)in_RDI[3] + 0x31) != '\0')) ||
                  (*(code **)(*(long *)in_RDI[3] + 0x10) != mpcf_fold_ast)))) break;
              puVar2 = *(undefined8 **)in_RDI[3];
              iVar4 = *(int *)(in_RDI + 1);
              iVar1 = *(int *)(puVar2 + 1);
              *(int *)(in_RDI + 1) = iVar4 + iVar1 + -1;
              pvVar3 = realloc((void *)in_RDI[3],(long)(iVar4 + iVar1 + -1) << 3);
              in_RDI[3] = pvVar3;
              pvVar3 = realloc((void *)in_RDI[4],(long)(iVar4 + iVar1 + -2) << 3);
              in_RDI[4] = pvVar3;
              memmove((void *)(in_RDI[3] + (long)iVar1 * 8),(void *)(in_RDI[3] + 8),
                      (long)(iVar4 + -1) << 3);
              memmove((void *)in_RDI[3],(void *)puVar2[3],(long)iVar1 << 3);
              for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 1) + -1; iVar4 = iVar4 + 1) {
                *(code **)(in_RDI[4] + (long)iVar4 * 8) = mpc_ast_delete;
              }
              free((void *)puVar2[3]);
              free((void *)puVar2[4]);
              free((void *)*puVar2);
              free(puVar2);
            }
            if (((*(char *)(in_RDI + 6) != '\x18') || ((code *)in_RDI[2] != mpcf_fold_ast)) ||
               ((*(char *)(*(long *)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8) + 0x30) !=
                 '\x18' ||
                ((*(char *)(*(long *)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8) + 0x31) !=
                  '\0' || (*(code **)(*(long *)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8) +
                                     0x10) != mpcf_fold_ast)))))) break;
            puVar2 = *(undefined8 **)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8);
            iVar4 = *(int *)(in_RDI + 1);
            iVar1 = *(int *)(puVar2 + 1);
            *(int *)(in_RDI + 1) = iVar4 + iVar1 + -1;
            pvVar3 = realloc((void *)in_RDI[3],(long)(iVar4 + iVar1 + -1) << 3);
            in_RDI[3] = pvVar3;
            pvVar3 = realloc((void *)in_RDI[4],(long)(iVar4 + iVar1 + -2) << 3);
            in_RDI[4] = pvVar3;
            memmove((void *)(in_RDI[3] + (long)iVar4 * 8 + -8),(void *)puVar2[3],(long)iVar1 << 3);
            for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 1) + -1; iVar4 = iVar4 + 1) {
              *(code **)(in_RDI[4] + (long)iVar4 * 8) = mpc_ast_delete;
            }
            free((void *)puVar2[3]);
            free((void *)puVar2[4]);
            free((void *)*puVar2);
            free(puVar2);
          }
          if ((*(char *)(in_RDI + 6) != '\x18') ||
             ((((*(int *)(in_RDI + 1) != 2 || (*(char *)(*(long *)in_RDI[3] + 0x30) != '\x03')) ||
               (*(code **)(*(long *)in_RDI[3] + 8) != mpcf_ctor_str)) ||
              ((*(char *)(*(long *)in_RDI[3] + 0x31) != '\0' || ((code *)in_RDI[2] != mpcf_strfold))
              )))) break;
          pvVar3 = *(void **)(in_RDI[3] + 8);
          mpc_delete((mpc_parser_t *)0x29efdf);
          free((void *)in_RDI[3]);
          free((void *)in_RDI[4]);
          free((void *)*in_RDI);
          memcpy(in_RDI,pvVar3,0x38);
          free(pvVar3);
        }
        if ((((*(char *)(in_RDI + 6) != '\x18') ||
             (((code *)in_RDI[2] != mpcf_strfold || (*(char *)(*(long *)in_RDI[3] + 0x30) != '\x18')
              ))) || (*(char *)(*(long *)in_RDI[3] + 0x31) != '\0')) ||
           (*(code **)(*(long *)in_RDI[3] + 0x10) != mpcf_strfold)) break;
        puVar2 = *(undefined8 **)in_RDI[3];
        iVar4 = *(int *)(in_RDI + 1);
        iVar1 = *(int *)(puVar2 + 1);
        *(int *)(in_RDI + 1) = iVar4 + iVar1 + -1;
        pvVar3 = realloc((void *)in_RDI[3],(long)(iVar4 + iVar1 + -1) << 3);
        in_RDI[3] = pvVar3;
        pvVar3 = realloc((void *)in_RDI[4],(long)(iVar4 + iVar1 + -2) << 3);
        in_RDI[4] = pvVar3;
        memmove((void *)(in_RDI[3] + (long)iVar1 * 8),(void *)(in_RDI[3] + 8),
                (long)(iVar4 + -1) << 3);
        memmove((void *)in_RDI[3],(void *)puVar2[3],(long)iVar1 << 3);
        for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 1) + -1; iVar4 = iVar4 + 1) {
          *(code **)(in_RDI[4] + (long)iVar4 * 8) = free;
        }
        free((void *)puVar2[3]);
        free((void *)puVar2[4]);
        free((void *)*puVar2);
        free(puVar2);
      }
      if ((((*(char *)(in_RDI + 6) != '\x18') || ((code *)in_RDI[2] != mpcf_strfold)) ||
          (*(char *)(*(long *)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8) + 0x30) != '\x18')
          ) || ((*(char *)(*(long *)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8) + 0x31) !=
                 '\0' || (*(code **)(*(long *)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8) +
                                    0x10) != mpcf_strfold)))) break;
      puVar2 = *(undefined8 **)(in_RDI[3] + (long)(*(int *)(in_RDI + 1) + -1) * 8);
      iVar4 = *(int *)(in_RDI + 1);
      iVar1 = *(int *)(puVar2 + 1);
      *(int *)(in_RDI + 1) = iVar4 + iVar1 + -1;
      pvVar3 = realloc((void *)in_RDI[3],(long)(iVar4 + iVar1 + -1) << 3);
      in_RDI[3] = pvVar3;
      pvVar3 = realloc((void *)in_RDI[4],(long)(iVar4 + iVar1 + -2) << 3);
      in_RDI[4] = pvVar3;
      memmove((void *)(in_RDI[3] + (long)iVar4 * 8 + -8),(void *)puVar2[3],(long)iVar1 << 3);
      for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 1) + -1; iVar4 = iVar4 + 1) {
        *(code **)(in_RDI[4] + (long)iVar4 * 8) = free;
      }
      free((void *)puVar2[3]);
      free((void *)puVar2[4]);
      free((void *)*puVar2);
      free(puVar2);
    }
  }
  return;
}

Assistant:

static void mpc_optimise_unretained(mpc_parser_t *p, int force) {

  int i, n, m;
  mpc_parser_t *t;

  if (p->retained && !force) { return; }

  /* Optimise Subexpressions */

  if (p->type == MPC_TYPE_EXPECT)     { mpc_optimise_unretained(p->data.expect.x, 0); }
  if (p->type == MPC_TYPE_APPLY)      { mpc_optimise_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO)   { mpc_optimise_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_CHECK)      { mpc_optimise_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { mpc_optimise_unretained(p->data.check_with.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)    { mpc_optimise_unretained(p->data.predict.x, 0); }
  if (p->type == MPC_TYPE_NOT)        { mpc_optimise_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE)      { mpc_optimise_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MANY)       { mpc_optimise_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1)      { mpc_optimise_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT)      { mpc_optimise_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    for(i = 0; i < p->data.or.n; i++) {
      mpc_optimise_unretained(p->data.or.xs[i], 0);
    }
  }

  if (p->type == MPC_TYPE_AND) {
    for(i = 0; i < p->data.and.n; i++) {
      mpc_optimise_unretained(p->data.and.xs[i], 0);
    }
  }

  /* Perform optimisations */

  while (1) {

    /* Merge rhs `or` */
    if (p->type == MPC_TYPE_OR
    &&  p->data.or.xs[p->data.or.n-1]->type == MPC_TYPE_OR
    && !p->data.or.xs[p->data.or.n-1]->retained) {
      t = p->data.or.xs[p->data.or.n-1];
      n = p->data.or.n; m = t->data.or.n;
      p->data.or.n = n + m - 1;
      p->data.or.xs = realloc(p->data.or.xs, sizeof(mpc_parser_t*) * (n + m -1));
      memmove(p->data.or.xs + n - 1, t->data.or.xs, m * sizeof(mpc_parser_t*));
      free(t->data.or.xs); free(t->name); free(t);
      continue;
    }

    /* Merge lhs `or` */
    if (p->type == MPC_TYPE_OR
    &&  p->data.or.xs[0]->type == MPC_TYPE_OR
    && !p->data.or.xs[0]->retained) {
      t = p->data.or.xs[0];
      n = p->data.or.n; m = t->data.or.n;
      p->data.or.n = n + m - 1;
      p->data.or.xs = realloc(p->data.or.xs, sizeof(mpc_parser_t*) * (n + m -1));
      memmove(p->data.or.xs + m, p->data.or.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.or.xs, t->data.or.xs, m * sizeof(mpc_parser_t*));
      free(t->data.or.xs); free(t->name); free(t);
      continue;
    }

    /* Remove ast `pass` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.n == 2
    &&  p->data.and.xs[0]->type == MPC_TYPE_PASS
    && !p->data.and.xs[0]->retained
    &&  p->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[1];
      mpc_delete(p->data.and.xs[0]);
      free(p->data.and.xs); free(p->data.and.dxs); free(p->name);
      memcpy(p, t, sizeof(mpc_parser_t));
      free(t);
      continue;
    }

    /* Merge ast lhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_fold_ast
    &&  p->data.and.xs[0]->type == MPC_TYPE_AND
    && !p->data.and.xs[0]->retained
    &&  p->data.and.xs[0]->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[0];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m - 1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + m, p->data.and.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.and.xs, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = (mpc_dtor_t)mpc_ast_delete; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Merge ast rhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_fold_ast
    &&  p->data.and.xs[p->data.and.n-1]->type == MPC_TYPE_AND
    && !p->data.and.xs[p->data.and.n-1]->retained
    &&  p->data.and.xs[p->data.and.n-1]->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[p->data.and.n-1];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m -1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + n - 1, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = (mpc_dtor_t)mpc_ast_delete; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Remove re `lift` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.n == 2
    &&  p->data.and.xs[0]->type == MPC_TYPE_LIFT
    &&  p->data.and.xs[0]->data.lift.lf == mpcf_ctor_str
    && !p->data.and.xs[0]->retained
    &&  p->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[1];
      mpc_delete(p->data.and.xs[0]);
      free(p->data.and.xs); free(p->data.and.dxs); free(p->name);
      memcpy(p, t, sizeof(mpc_parser_t));
      free(t);
      continue;
    }

    /* Merge re lhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_strfold
    &&  p->data.and.xs[0]->type == MPC_TYPE_AND
    && !p->data.and.xs[0]->retained
    &&  p->data.and.xs[0]->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[0];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m - 1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + m, p->data.and.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.and.xs, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = free; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Merge re rhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_strfold
    &&  p->data.and.xs[p->data.and.n-1]->type == MPC_TYPE_AND
    && !p->data.and.xs[p->data.and.n-1]->retained
    &&  p->data.and.xs[p->data.and.n-1]->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[p->data.and.n-1];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m -1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + n - 1, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = free; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    return;

  }

}